

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O1

void CheckStackTrace(int i)

{
  bool bVar1;
  
  expected_range[5].start = (void *)0x1089ab;
  expected_range[5].end = (void *)0x1089bf;
  if (-1 < i) {
    do {
      CheckStackTrace1(i);
      bVar1 = 0 < i;
      i = i + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void ATTRIBUTE_NOINLINE
    CheckStackTrace(int i) {
  INIT_ADDRESS_RANGE(CheckStackTrace, start, end, &expected_range[5]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTrace1(j);
  }
  DECLARE_ADDRESS_LABEL(end);
}